

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(SessionHandle *data,connectdata **in_connect,_Bool *asyncp,
                     _Bool *protocol_done)

{
  undefined1 auVar1 [16];
  curl_proxytype cVar2;
  uint uVar3;
  void *pvVar4;
  char cVar5;
  int iVar6;
  CURLcode CVar7;
  CURLcode CVar8;
  SessionHandle *pSVar9;
  SessionHandle *pSVar10;
  connectdata *pcVar11;
  char *pcVar12;
  curl_llist *pcVar13;
  size_t sVar14;
  char *pcVar15;
  size_t sVar16;
  char *pcVar17;
  char *pcVar18;
  byte *__dest;
  long lVar19;
  ulong uVar20;
  connectdata *pcVar21;
  _Bool _Var22;
  hostname *host;
  Curl_handler *pCVar23;
  connectbundle *bundle;
  Curl_handler **ppCVar24;
  bool bVar25;
  _Bool _Var26;
  char cVar27;
  undefined1 auVar28 [16];
  timeval tVar29;
  _Bool force_reuse;
  char *passwd;
  char *userp;
  char *passwdp;
  connectdata *conn_temp;
  char protobuf [16];
  _Bool local_d1;
  connectdata **local_d0;
  undefined4 local_c4;
  char *local_c0;
  _Bool *local_b8;
  char *local_b0;
  char *local_a8;
  size_t local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  SessionHandle *local_80;
  SessionHandle *local_78;
  char *local_70;
  _Bool *local_68;
  connectdata *local_60;
  undefined1 local_58 [16];
  char *local_40;
  size_t local_38;
  
  *asyncp = false;
  local_60 = (connectdata *)0x0;
  local_a8 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_98 = (char *)0x0;
  local_d1 = false;
  local_68 = protocol_done;
  pSVar9 = (SessionHandle *)Curl_multi_max_host_connections(data->multi);
  pSVar10 = (SessionHandle *)Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  if ((data->change).url == (char *)0x0) {
    pcVar12 = local_98;
    CVar7 = CURLE_URL_MALFORMAT;
    goto LAB_0047861c;
  }
  local_80 = pSVar9;
  local_78 = pSVar10;
  pcVar11 = (connectdata *)(*Curl_ccalloc)(1,0x618);
  pcVar12 = local_98;
  CVar7 = CURLE_OUT_OF_MEMORY;
  if (pcVar11 == (connectdata *)0x0) goto LAB_0047861c;
  pcVar11->handler = &Curl_handler_dummy;
  pcVar11->connection_id = -1;
  pcVar11->port = -1;
  pcVar11->remote_port = -1;
  pcVar11->sock[0] = -1;
  pcVar11->sock[1] = -1;
  pcVar11->tempsock[0] = -1;
  pcVar11->tempsock[1] = -1;
  (pcVar11->bits).close = true;
  tVar29 = curlx_tvnow();
  pcVar11->created = tVar29;
  pcVar11->data = data;
  cVar2 = (data->set).proxytype;
  pcVar11->proxytype = cVar2;
  pcVar12 = (data->set).str[0x10];
  if (pcVar12 == (char *)0x0) {
    (pcVar11->bits).proxy = false;
LAB_004784af:
    _Var26 = false;
  }
  else {
    bVar25 = *pcVar12 == '\0';
    (pcVar11->bits).proxy = !bVar25;
    if (bVar25) goto LAB_004784af;
    if (cVar2 == CURLPROXY_HTTP) {
      _Var26 = true;
    }
    else {
      _Var26 = cVar2 == CURLPROXY_HTTP_1_0;
    }
  }
  (pcVar11->bits).httpproxy = _Var26;
  (pcVar11->bits).proxy_user_passwd = (data->set).str[0x1f] != (char *)0x0;
  (pcVar11->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar11->bits).user_passwd = (data->set).str[0x1c] != (char *)0x0;
  (pcVar11->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar11->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  pcVar11->verifypeer = (data->set).ssl.verifypeer;
  pcVar11->verifyhost = (data->set).ssl.verifyhost;
  pcVar11->ip_version = (data->set).ipver;
  _Var26 = Curl_multi_pipeline_enabled(data->multi);
  if ((_Var26) && (pcVar11->master_buffer == (char *)0x0)) {
    pcVar12 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar11->master_buffer = pcVar12;
    if (pcVar12 != (char *)0x0) goto LAB_00478564;
  }
  else {
LAB_00478564:
    pcVar13 = Curl_llist_alloc(llist_dtor);
    pcVar11->send_pipe = pcVar13;
    pcVar13 = Curl_llist_alloc(llist_dtor);
    pcVar11->recv_pipe = pcVar13;
    if (pcVar13 != (curl_llist *)0x0 && pcVar11->send_pipe != (curl_llist *)0x0) {
      pcVar12 = (data->set).str[5];
      if (pcVar12 != (char *)0x0) {
        pcVar12 = (*Curl_cstrdup)(pcVar12);
        pcVar11->localdev = pcVar12;
        if (pcVar12 == (char *)0x0) goto LAB_004785a2;
      }
      pcVar11->localportrange = (data->set).localportrange;
      pcVar11->localport = (data->set).localport;
      pvVar4 = (data->set).closesocket_client;
      pcVar11->fclosesocket = (data->set).fclosesocket;
      pcVar11->closesocket_client = pvVar4;
      *in_connect = pcVar11;
      sVar14 = strlen((data->change).url);
      sVar16 = 0x100;
      if (0x100 < sVar14) {
        sVar16 = sVar14;
      }
      pcVar12 = (data->state).pathbuffer;
      if (pcVar12 != (char *)0x0) {
        (*Curl_cfree)(pcVar12);
        (data->state).pathbuffer = (char *)0x0;
      }
      (data->state).path = (char *)0x0;
      pcVar12 = (char *)(*Curl_cmalloc)(sVar16 + 2);
      (data->state).pathbuffer = pcVar12;
      if (pcVar12 == (char *)0x0) {
LAB_0047916f:
        pcVar12 = local_98;
        CVar7 = CURLE_OUT_OF_MEMORY;
        goto LAB_0047861c;
      }
      (data->state).path = pcVar12;
      pcVar12 = (char *)(*Curl_cmalloc)(sVar16 + 2);
      (pcVar11->host).rawalloc = pcVar12;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = (data->state).pathbuffer;
        if (pcVar12 != (char *)0x0) {
          (*Curl_cfree)(pcVar12);
          (data->state).pathbuffer = (char *)0x0;
        }
        (data->state).path = (char *)0x0;
        pcVar12 = local_98;
        CVar7 = CURLE_OUT_OF_MEMORY;
        goto LAB_0047861c;
      }
      (pcVar11->host).name = pcVar12;
      *pcVar12 = '\0';
      local_d0 = in_connect;
      local_b8 = asyncp;
      pcVar12 = (*Curl_cstrdup)("");
      local_a8 = pcVar12;
      pcVar15 = (*Curl_cstrdup)("");
      local_b0 = pcVar15;
      local_98 = (*Curl_cstrdup)("");
      if (local_98 == (char *)0x0 || (pcVar15 == (char *)0x0 || pcVar12 == (char *)0x0)) {
        pcVar12 = local_98;
        in_connect = local_d0;
        asyncp = local_b8;
        CVar7 = CURLE_OUT_OF_MEMORY;
        goto LAB_0047861c;
      }
      pcVar15 = (data->state).path;
      local_c0 = local_58;
      local_58 = (undefined1  [16])0x0;
      local_40 = local_98;
      iVar6 = __isoc99_sscanf((data->change).url,"%15[^:]:%[^\n]");
      asyncp = local_b8;
      in_connect = local_d0;
      if ((iVar6 == 2) && (iVar6 = Curl_raw_equal(local_58,"file"), iVar6 != 0)) {
        if (*pcVar15 == '/') {
          if (pcVar15[1] == '/') {
            sVar16 = strlen(pcVar15 + 2);
            memmove(pcVar15,pcVar15 + 2,sVar16 + 1);
            if (*pcVar15 != '/') goto LAB_004788d4;
          }
        }
        else {
LAB_004788d4:
          pcVar12 = strchr(pcVar15,0x2f);
          if (pcVar12 != (char *)0x0) {
            pcVar18 = pcVar12 + 1;
            if (pcVar12[1] != '/') {
              pcVar18 = pcVar12;
            }
            sVar16 = strlen(pcVar18);
            memmove(pcVar15,pcVar18,sVar16 + 1);
          }
        }
        local_c4 = 0;
        local_c0 = "file";
      }
      else {
        *pcVar15 = '\0';
        local_c4 = 0;
        iVar6 = __isoc99_sscanf((data->change).url,"%15[^\n:]://%[^\n/?]%[^\n]",local_58,
                                (pcVar11->host).name,pcVar15);
        if (iVar6 < 2) {
          pcVar12 = pcVar15;
          iVar6 = __isoc99_sscanf((data->change).url,"%[^\n/?]%[^\n]",(pcVar11->host).name,pcVar15);
          if (iVar6 < 1) {
            Curl_failf(data,"<url> malformed");
            CVar7 = CURLE_URL_MALFORMAT;
            pcVar12 = local_98;
            goto LAB_0047861c;
          }
          iVar6 = Curl_raw_nequal("FTP.",(pcVar11->host).name,4);
          local_c4 = (undefined4)CONCAT71((int7)((ulong)pcVar12 >> 8),1);
          if (iVar6 == 0) {
            iVar6 = Curl_raw_nequal("DICT.",(pcVar11->host).name,5);
            if (iVar6 == 0) {
              iVar6 = Curl_raw_nequal("LDAP.",(pcVar11->host).name,5);
              if (iVar6 == 0) {
                iVar6 = Curl_raw_nequal("IMAP.",(pcVar11->host).name,5);
                if (iVar6 == 0) {
                  iVar6 = Curl_raw_nequal("SMTP.",(pcVar11->host).name,5);
                  if (iVar6 == 0) {
                    iVar6 = Curl_raw_nequal("POP3.",(pcVar11->host).name,5);
                    local_c0 = "pop3";
                    if (iVar6 == 0) {
                      local_c0 = "http";
                    }
                  }
                  else {
                    local_c0 = "smtp";
                  }
                }
                else {
                  local_c0 = "IMAP";
                }
              }
              else {
                local_c0 = "LDAP";
              }
            }
            else {
              local_c0 = "DICT";
            }
          }
          else {
            local_c0 = "ftp";
          }
        }
      }
      pcVar12 = (pcVar11->host).name;
      pcVar17 = strchr(pcVar12,0x40);
      pcVar18 = pcVar17 + 1;
      if (pcVar17 == (char *)0x0) {
        pcVar18 = pcVar12;
      }
      pcVar12 = strchr(pcVar18,0x3f);
      cVar27 = pcVar12 != (char *)0x0;
      if ((bool)cVar27) {
        sVar16 = strlen(pcVar12);
        local_a0 = CONCAT71(local_a0._1_7_,cVar27);
        sVar14 = strlen(pcVar15);
        memmove(pcVar15 + sVar16 + 1,pcVar15,sVar14 + 1);
        cVar27 = (char)local_a0;
        memcpy(pcVar15 + 1,pcVar12,sVar16);
        *pcVar15 = '/';
        *pcVar12 = '\0';
        cVar5 = *pcVar15;
LAB_00478b68:
        if (cVar5 != '?') goto LAB_00478ba0;
        sVar16 = strlen(pcVar15);
        memmove(pcVar15 + 1,pcVar15,sVar16 + 1);
        *pcVar15 = '/';
        goto LAB_00478bf3;
      }
      cVar5 = *pcVar15;
      if (cVar5 != '\0') goto LAB_00478b68;
      pcVar15[0] = '/';
      pcVar15[1] = '\0';
      cVar27 = '\x01';
LAB_00478ba0:
      pcVar12 = Curl_dedotdotify(pcVar15);
      if (pcVar12 == (char *)0x0) {
        CVar7 = CURLE_OUT_OF_MEMORY;
        pcVar12 = local_98;
        in_connect = local_d0;
        goto LAB_0047861c;
      }
      iVar6 = strcmp(pcVar12,pcVar15);
      if (iVar6 == 0) {
        (*Curl_cfree)(pcVar12);
        in_connect = local_d0;
        if (cVar27 != '\0') goto LAB_00478bf3;
      }
      else {
        (*Curl_cfree)((data->state).pathbuffer);
        (data->state).pathbuffer = pcVar12;
        (data->state).path = pcVar12;
        pcVar15 = pcVar12;
LAB_00478bf3:
        in_connect = local_d0;
        local_a0 = strlen(pcVar15);
        sVar16 = strlen((data->change).url);
        local_38 = strlen((pcVar11->host).name);
        if ((char)local_c4 == '\0') {
          sVar14 = strlen(local_c0);
          local_38 = local_38 + sVar14 + 3;
        }
        pcVar12 = (char *)(*Curl_cmalloc)(sVar16 + 2);
        sVar16 = local_38;
        if (pcVar12 == (char *)0x0) {
          CVar7 = CURLE_OUT_OF_MEMORY;
          pcVar12 = local_98;
          goto LAB_0047861c;
        }
        memcpy(pcVar12,(data->change).url,local_38);
        memcpy(pcVar12 + sVar16,pcVar15,local_a0 + 1);
        if ((data->change).url_alloc == true) {
          pcVar18 = (data->change).url;
          if (pcVar18 != (char *)0x0) {
            (*Curl_cfree)(pcVar18);
            (data->change).url = (char *)0x0;
          }
          (data->change).url_alloc = false;
        }
        Curl_infof(data,"Rebuilt URL to: %s\n",pcVar12);
        (data->change).url = pcVar12;
        (data->change).url_alloc = true;
      }
      CVar7 = CURLE_OK;
      local_90 = (char *)0x0;
      local_88 = (char *)0x0;
      local_70 = (char *)0x0;
      pcVar12 = (pcVar11->host).name;
      pcVar18 = strchr(pcVar12,0x40);
      if (pcVar18 != (char *)0x0) {
        (pcVar11->host).name = pcVar18 + 1;
        if (((data->set).use_netrc != CURL_NETRC_REQUIRED) &&
           (CVar7 = parse_login_details(pcVar12,(size_t)(pcVar18 + 1 + ~(ulong)pcVar12),&local_90,
                                        &local_88,&local_70), CVar7 == CURLE_OK)) {
          if (local_90 == (char *)0x0) {
LAB_00478e92:
            if (local_88 != (char *)0x0) {
              pcVar12 = curl_easy_unescape(data,local_88,0,(int *)0x0);
              if (pcVar12 == (char *)0x0) goto LAB_00478f2c;
              (*Curl_cfree)(local_b0);
              local_b0 = pcVar12;
            }
            CVar7 = CURLE_OK;
            if (local_70 != (char *)0x0) {
              CVar7 = CURLE_OK;
              pcVar12 = curl_easy_unescape(data,local_70,0,(int *)0x0);
              if (pcVar12 == (char *)0x0) goto LAB_00478f2c;
              (*Curl_cfree)(local_40);
              local_98 = pcVar12;
            }
          }
          else {
            (pcVar11->bits).userpwd_in_url = true;
            (pcVar11->bits).user_passwd = true;
            pcVar12 = curl_easy_unescape(data,local_90,0,(int *)0x0);
            if (pcVar12 != (char *)0x0) {
              (*Curl_cfree)(local_a8);
              local_a8 = pcVar12;
              goto LAB_00478e92;
            }
LAB_00478f2c:
            CVar7 = CURLE_OUT_OF_MEMORY;
          }
        }
      }
      if (local_90 != (char *)0x0) {
        (*Curl_cfree)(local_90);
        local_90 = (char *)0x0;
      }
      if (local_88 != (char *)0x0) {
        (*Curl_cfree)(local_88);
        local_88 = (char *)0x0;
      }
      if (local_70 != (char *)0x0) {
        (*Curl_cfree)(local_70);
      }
      pcVar12 = local_98;
      if (CVar7 == CURLE_OK) {
        pcVar12 = (pcVar11->host).name;
        if ((*pcVar12 == '[') && (__dest = (byte *)strchr(pcVar12,0x25), __dest != (byte *)0x0)) {
          iVar6 = *__dest - 0x25;
          if ((iVar6 == 0) && (iVar6 = __dest[1] - 0x32, iVar6 == 0)) {
            iVar6 = 0x35 - (uint)__dest[2];
          }
          else {
            iVar6 = -iVar6;
          }
          if (iVar6 == 0) {
            lVar19 = 3;
          }
          else {
            Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            lVar19 = 1;
          }
          uVar20 = strtoul((char *)(__dest + lVar19),&local_90,10);
          pcVar12 = local_90;
          if (*local_90 == ']') {
            local_a0 = uVar20;
            sVar16 = strlen(local_90);
            memmove(__dest,pcVar12,sVar16 + 1);
            pcVar11->scope = (uint)local_a0;
          }
          else {
            Curl_infof(data,"Invalid IPv6 address format\n");
          }
        }
        uVar3 = (data->set).scope;
        if (uVar3 != 0) {
          pcVar11->scope = uVar3;
        }
        pcVar12 = strchr(pcVar15,0x23);
        if (pcVar12 != (char *)0x0) {
          *pcVar12 = '\0';
          pcVar12 = strchr((data->change).url,0x23);
          if (pcVar12 != (char *)0x0) {
            *pcVar12 = '\0';
          }
        }
        pCVar23 = &Curl_handler_http;
        ppCVar24 = protocols;
        do {
          ppCVar24 = ppCVar24 + 1;
          iVar6 = Curl_raw_equal(pCVar23->scheme,local_c0);
          if (iVar6 != 0) {
            if ((((uint)(data->set).allowed_protocols & pCVar23->protocol) != 0) &&
               (((data->state).this_is_a_follow != true ||
                (((uint)(data->set).redir_protocols & pCVar23->protocol) != 0)))) {
              pcVar11->given = pCVar23;
              pcVar11->handler = pCVar23;
              if ((char)local_c4 != '\0') {
                pcVar15 = curl_maprintf("%s://%s",pCVar23->scheme,(data->change).url);
                pcVar12 = local_98;
                CVar7 = CURLE_OUT_OF_MEMORY;
                if (pcVar15 == (char *)0x0) goto LAB_0047861c;
                if (((data->change).url_alloc == true) &&
                   (pcVar12 = (data->change).url, pcVar12 != (char *)0x0)) {
                  (*Curl_cfree)(pcVar12);
                }
                (data->change).url = pcVar15;
                (data->change).url_alloc = true;
                pCVar23 = pcVar11->given;
              }
              if (((pCVar23->flags & 0x40) != 0) &&
                 (pcVar12 = strchr((pcVar11->data->state).path,0x3f), pcVar12 != (char *)0x0)) {
                *pcVar12 = '\0';
              }
              pcVar12 = (data->set).str[0x27];
              if (pcVar12 != (char *)0x0) {
                pcVar15 = (*Curl_cstrdup)(pcVar12);
                pcVar11->xoauth2_bearer = pcVar15;
                pcVar12 = local_98;
                CVar7 = CURLE_OUT_OF_MEMORY;
                if (pcVar15 == (char *)0x0) goto LAB_0047861c;
              }
              if (((pcVar11->bits).proxy_user_passwd == true) &&
                 (CVar7 = parse_proxy_auth(data,pcVar11), pcVar12 = local_98, CVar7 != CURLE_OK))
              goto LAB_0047861c;
              pcVar12 = (data->set).str[0x10];
              if (pcVar12 == (char *)0x0) {
                pcVar12 = (char *)0x0;
              }
              else {
                pcVar12 = (*Curl_cstrdup)(pcVar12);
                if (pcVar12 == (char *)0x0) {
                  Curl_failf(data,"memory shortage");
                  goto LAB_0047916f;
                }
              }
              pcVar15 = (data->set).str[0x21];
              if ((pcVar15 == (char *)0x0) ||
                 (_Var26 = check_noproxy((pcVar11->host).name,pcVar15), !_Var26)) {
                if ((pcVar12 == (char *)0x0) &&
                   (pcVar12 = detect_proxy(pcVar11), pcVar12 == (char *)0x0)) goto LAB_00479201;
                if ((*pcVar12 == '\0') || ((pcVar11->handler->flags & 0x10) != 0))
                goto LAB_004791f5;
                CVar7 = parse_proxy(data,pcVar11,pcVar12);
                (*Curl_cfree)(pcVar12);
                pcVar12 = local_98;
                in_connect = local_d0;
                asyncp = local_b8;
                if (CVar7 != CURLE_OK) goto LAB_0047861c;
                if (pcVar11->proxytype < 2) {
                  _Var26 = true;
                  if (((pcVar11->handler->protocol & 3) == 0) &&
                     ((pcVar11->bits).tunnel_proxy == false)) {
                    pcVar11->handler = &Curl_handler_http;
                  }
                }
                else {
                  _Var26 = false;
                }
                (pcVar11->bits).httpproxy = _Var26;
                (pcVar11->bits).proxy = true;
                _Var22 = true;
                if ((_Var26 & (byte)pcVar11->given->flags) != 0) goto LAB_00479215;
              }
              else {
                if (pcVar12 != (char *)0x0) {
LAB_004791f5:
                  (*Curl_cfree)(pcVar12);
                }
LAB_00479201:
                (pcVar11->bits).proxy = false;
                (pcVar11->bits).httpproxy = false;
                (pcVar11->bits).proxy_user_passwd = false;
                _Var22 = false;
LAB_00479215:
                (pcVar11->bits).tunnel_proxy = _Var22;
              }
              CVar7 = parse_remote_port(data,pcVar11);
              pcVar12 = local_98;
              if ((((CVar7 != CURLE_OK) ||
                   (CVar7 = override_login(data,pcVar11,&local_a8,&local_b0,&local_98),
                   pcVar12 = local_98, CVar7 != CURLE_OK)) ||
                  (CVar7 = set_login(pcVar11,local_a8,local_b0,local_98), CVar7 != CURLE_OK)) ||
                 (CVar7 = setup_connection_internals(pcVar11), pcVar12 = local_98,
                 in_connect = local_d0, asyncp = local_b8, CVar7 != CURLE_OK)) goto LAB_0047861c;
              pcVar11->recv[0] = Curl_recv_plain;
              pcVar11->send[0] = Curl_send_plain;
              pcVar11->recv[1] = Curl_recv_plain;
              pcVar11->send[1] = Curl_send_plain;
              if ((pcVar11->handler->flags & 0x10) == 0) {
                pcVar12 = (data->set).str[0x15];
                (data->set).ssl.CApath = (data->set).str[0x14];
                (data->set).ssl.CAfile = pcVar12;
                pcVar12 = (data->set).str[0x1b];
                (data->set).ssl.CRLfile = (data->set).str[0x1a];
                (data->set).ssl.issuercert = pcVar12;
                auVar1 = *(undefined1 (*) [16])((data->set).str + 0x17);
                auVar28._0_8_ = auVar1._8_8_;
                auVar28._8_4_ = auVar1._0_4_;
                auVar28._12_4_ = auVar1._4_4_;
                (data->set).ssl.random_file = (char *)auVar28._0_8_;
                (data->set).ssl.egdsocket = (char *)auVar28._8_8_;
                (data->set).ssl.cipher_list = (data->set).str[0x16];
                _Var26 = Curl_clone_ssl_config(&(data->set).ssl,&pcVar11->ssl_config);
                pcVar12 = local_98;
                in_connect = local_d0;
                asyncp = local_b8;
                CVar7 = CURLE_OUT_OF_MEMORY;
                if (_Var26) {
                  prune_dead_connections(data);
                  if ((((data->set).reuse_fresh == true) && ((data->state).this_is_a_follow != true)
                      ) || (_Var26 = ConnectionExists(data,pcVar11,&local_60,&local_d1),
                           pcVar21 = local_60, !_Var26)) {
LAB_004794c5:
                    bundle = (connectbundle *)(pcVar11->host).name;
                    pSVar9 = (SessionHandle *)
                             Curl_conncache_find_bundle((data->state).conn_cache,(char *)bundle);
                    bVar25 = false;
                    if ((local_80 != (SessionHandle *)0x0) &&
                       (bVar25 = false, pSVar9 != (SessionHandle *)0x0)) {
                      if (pSVar9->prev < local_80) {
                        bVar25 = false;
                      }
                      else {
                        pcVar21 = find_oldest_idle_connection_in_bundle(pSVar9,bundle);
                        if (pcVar21 == (connectdata *)0x0) {
                          bVar25 = true;
                        }
                        else {
                          pcVar21->data = data;
                          bVar25 = false;
                          Curl_disconnect(pcVar21,false);
                        }
                      }
                    }
                    if ((local_78 == (SessionHandle *)0x0) ||
                       (pSVar9 = (SessionHandle *)(data->state).conn_cache, pSVar9->prev < local_78)
                       ) {
LAB_0047964a:
                      if (!bVar25) {
                        Curl_conncache_add_conn((data->state).conn_cache,pcVar11);
                        if ((((data->state).authhost.picked & 0x28) != 0) &&
                           ((data->state).authhost.done == true)) {
                          Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                          (data->state).authhost.picked = 0;
                        }
                        if ((((data->state).authproxy.picked & 0x28) != 0) &&
                           ((data->state).authproxy.done == true)) {
                          Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
                          (data->state).authproxy.picked = 0;
                        }
                        goto LAB_004796f8;
                      }
                    }
                    else {
                      pcVar21 = find_oldest_idle_connection(pSVar9);
                      if (pcVar21 != (connectdata *)0x0) {
                        pcVar21->data = data;
                        Curl_disconnect(pcVar21,false);
                        goto LAB_0047964a;
                      }
                    }
                    Curl_infof(data,"No connections available.\n");
                    conn_free(pcVar11);
                    *local_d0 = (connectdata *)0x0;
                    pcVar12 = local_98;
                    in_connect = local_d0;
                    asyncp = local_b8;
                    CVar7 = CURLE_NO_CONNECTION_AVAILABLE;
                  }
                  else {
                    if (((local_d1 == false) &&
                        (_Var26 = IsPipeliningPossible
                                            (data,(connectdata *)(ulong)local_60->handler->protocol)
                        , _Var26)) &&
                       ((pcVar21->recv_pipe->size + pcVar21->send_pipe->size != 0 &&
                        ((Curl_infof(data,"Found connection %ld, with requests in the pipe (%zu)\n",
                                     pcVar21->connection_id),
                         (SessionHandle *)pcVar21->bundle->num_connections < local_80 &&
                         ((SessionHandle *)((data->state).conn_cache)->num_connections < local_78)))
                        ))) {
                      Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                      goto LAB_004794c5;
                    }
                    pcVar21->inuse = true;
                    reuse_conn(pcVar11,pcVar21);
                    (*Curl_cfree)(pcVar11);
                    *local_d0 = pcVar21;
                    fix_hostname(data,(connectdata *)&pcVar21->host,host);
                    Curl_infof(data,"Re-using existing connection! (#%ld) with host %s\n",
                               pcVar21->connection_id,
                               *(undefined8 *)
                                (pcVar21->primary_ip +
                                (ulong)((pcVar21->proxy).name != (char *)0x0) * 0x20 + -0x34));
                    pcVar11 = pcVar21;
LAB_004796f8:
                    pcVar11->inuse = true;
                    do_init(pcVar11);
                    CVar7 = setup_range(data);
                    asyncp = local_b8;
                    pcVar12 = local_98;
                    in_connect = local_d0;
                    if (CVar7 == CURLE_OK) {
                      pcVar11->fread_func = (data->set).fread_func;
                      pcVar11->fread_in = (data->set).in;
                      pcVar11->seek_func = (data->set).seek_func;
                      pcVar11->seek_client = (data->set).seek_client;
                      CVar7 = resolve_server(data,pcVar11,local_b8);
                      pcVar12 = local_98;
                      in_connect = local_d0;
                    }
                  }
                }
                goto LAB_0047861c;
              }
              CVar8 = (*pcVar11->handler->connect_it)(pcVar11,(_Bool *)local_58);
              if (CVar8 == CURLE_OK) {
                pcVar11->data = data;
                (pcVar11->bits).tcpconnect[0] = true;
                Curl_conncache_add_conn((data->state).conn_cache,pcVar11);
                CVar7 = setup_range(data);
                if (CVar7 != CURLE_OK) {
                  (*pcVar11->handler->done)(pcVar11,CVar7,false);
                  pcVar12 = local_98;
                  in_connect = local_d0;
                  asyncp = local_b8;
                  goto LAB_0047861c;
                }
                Curl_setup_transfer(pcVar11,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
              }
              do_init(pcVar11);
              pcVar12 = local_98;
              in_connect = local_d0;
              asyncp = local_b8;
              CVar7 = CVar8;
              goto LAB_0047861c;
            }
            break;
          }
          pCVar23 = *ppCVar24;
        } while (pCVar23 != (Curl_handler *)0x0);
        Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_c0);
        CVar7 = CURLE_UNSUPPORTED_PROTOCOL;
        pcVar12 = local_98;
      }
      goto LAB_0047861c;
    }
  }
LAB_004785a2:
  Curl_llist_destroy(pcVar11->send_pipe,(void *)0x0);
  Curl_llist_destroy(pcVar11->recv_pipe,(void *)0x0);
  pcVar11->send_pipe = (curl_llist *)0x0;
  pcVar11->recv_pipe = (curl_llist *)0x0;
  if (pcVar11->master_buffer != (char *)0x0) {
    (*Curl_cfree)(pcVar11->master_buffer);
    pcVar11->master_buffer = (char *)0x0;
  }
  if (pcVar11->localdev != (char *)0x0) {
    (*Curl_cfree)(pcVar11->localdev);
    pcVar11->localdev = (char *)0x0;
  }
  (*Curl_cfree)(pcVar11);
  pcVar12 = local_98;
LAB_0047861c:
  if (pcVar12 != (char *)0x0) {
    (*Curl_cfree)(pcVar12);
  }
  if (local_b0 != (char *)0x0) {
    (*Curl_cfree)(local_b0);
    local_b0 = (char *)0x0;
  }
  if (local_a8 != (char *)0x0) {
    (*Curl_cfree)(local_a8);
  }
  if (CVar7 == CURLE_OK) {
    pcVar11 = *in_connect;
    if ((pcVar11->send_pipe->size != 0) || (pcVar11->recv_pipe->size != 0)) {
      *local_68 = true;
      return CURLE_OK;
    }
    if (*asyncp != false) {
      return CURLE_OK;
    }
    CVar7 = Curl_setup_conn(pcVar11,local_68);
  }
  if (CVar7 != CURLE_OK) {
    if (CVar7 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar7 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(*in_connect,false);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar7;
}

Assistant:

CURLcode Curl_connect(struct SessionHandle *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode code;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  code = create_conn(data, in_connect, asyncp);

  if(CURLE_OK == code) {
    /* no error */
    if((*in_connect)->send_pipe->size || (*in_connect)->recv_pipe->size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      code = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(code == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return code;
  }

  if(code && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return code;
}